

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O1

void Spl_ManWinFindLeavesRoots(Spl_Man_t *p)

{
  uint *puVar1;
  int *piVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  int *piVar5;
  Gia_Obj_t *pGVar6;
  Vec_Wec_t *pVVar7;
  Vec_Bit_t *pVVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  int *piVar11;
  byte bVar12;
  Vec_Int_t *pVVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  
  p->vLeaves->nSize = 0;
  pVVar13 = p->vAnds;
  if (0 < pVVar13->nSize) {
    lVar20 = 0;
    do {
      uVar19 = pVVar13->pArray[lVar20];
      if (((int)uVar19 < 0) || (pGVar4 = p->pGia, pGVar4->nObjs <= (int)uVar19)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      iVar3 = p->vMarksAnd->nSize;
      if (iVar3 <= (int)uVar19) {
LAB_007c16a3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
      }
      piVar5 = p->vMarksAnd->pArray;
      if (((uint)piVar5[uVar19 >> 5] >> (uVar19 & 0x1f) & 1) == 0) {
        __assert_fail("Vec_BitEntry(p->vMarksAnd, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                      ,0xd0,"void Spl_ManWinFindLeavesRoots(Spl_Man_t *)");
      }
      pGVar6 = pGVar4->pObjs;
      uVar15 = uVar19 - (*(uint *)(pGVar6 + uVar19) & 0x1fffffff);
      if (((int)uVar15 < 0) || (iVar3 <= (int)uVar15)) goto LAB_007c16a3;
      uVar14 = uVar15 >> 5;
      uVar16 = uVar15 & 0x1f;
      if (((uint)piVar5[uVar14] >> uVar16 & 1) == 0) {
        if (pGVar4->vMapping2->nSize <= (int)uVar15) goto LAB_007c16c2;
        if (pGVar4->vMapping2->pArray[uVar15].nSize == 0) {
          if (p->vMarksCIO->nSize <= (int)uVar15) goto LAB_007c16a3;
          if (((uint)p->vMarksCIO->pArray[uVar14] >> uVar16 & 1) == 0) {
            __assert_fail("Gia_ObjIsLut2(p->pGia, iFan) || Vec_BitEntry(p->vMarksCIO, iFan)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                          ,0xd4,"void Spl_ManWinFindLeavesRoots(Spl_Man_t *)");
          }
        }
        piVar5[uVar14] = piVar5[uVar14] | 1 << uVar16;
        Vec_IntPush(p->vLeaves,uVar15);
      }
      uVar19 = uVar19 - (*(uint *)&pGVar6[uVar19].field_0x4 & 0x1fffffff);
      if (((int)uVar19 < 0) || (p->vMarksAnd->nSize <= (int)uVar19)) goto LAB_007c16a3;
      piVar5 = p->vMarksAnd->pArray;
      uVar14 = uVar19 >> 5;
      uVar15 = piVar5[uVar14];
      uVar16 = uVar19 & 0x1f;
      if ((uVar15 >> uVar16 & 1) == 0) {
        pVVar7 = p->pGia->vMapping2;
        if (pVVar7->nSize <= (int)uVar19) goto LAB_007c16c2;
        if (pVVar7->pArray[uVar19].nSize == 0) {
          if (p->vMarksCIO->nSize <= (int)uVar19) goto LAB_007c16a3;
          if (((uint)p->vMarksCIO->pArray[uVar14] >> uVar16 & 1) == 0) {
            __assert_fail("Gia_ObjIsLut2(p->pGia, iFan) || Vec_BitEntry(p->vMarksCIO, iFan)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                          ,0xdb,"void Spl_ManWinFindLeavesRoots(Spl_Man_t *)");
          }
        }
        piVar5[uVar14] = uVar15 | 1 << uVar16;
        Vec_IntPush(p->vLeaves,uVar19);
      }
      lVar20 = lVar20 + 1;
      pVVar13 = p->vAnds;
    } while (lVar20 < pVVar13->nSize);
  }
  pVVar13 = p->vLeaves;
  if (0 < pVVar13->nSize) {
    piVar5 = pVVar13->pArray;
    pVVar8 = p->vMarksAnd;
    lVar20 = 0;
    do {
      uVar19 = piVar5[lVar20];
      if (((int)uVar19 < 0) || (pVVar8->nSize <= (int)uVar19)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      bVar12 = (byte)uVar19 & 0x1f;
      puVar1 = (uint *)(pVVar8->pArray + (uVar19 >> 5));
      *puVar1 = *puVar1 & (-2 << bVar12 | 0xfffffffeU >> 0x20 - bVar12);
      lVar20 = lVar20 + 1;
    } while (lVar20 < pVVar13->nSize);
  }
  p->vRoots->nSize = 0;
  pVVar13 = p->vNodes;
  if (0 < pVVar13->nSize) {
    pGVar4 = p->pGia;
    pVVar7 = pGVar4->vMapping2;
    piVar5 = pVVar13->pArray;
    lVar20 = 0;
    do {
      lVar17 = (long)piVar5[lVar20];
      if ((lVar17 < 0) || (pVVar7->nSize <= piVar5[lVar20])) goto LAB_007c16c2;
      pVVar9 = pVVar7->pArray;
      if (pVVar9 == (Vec_Int_t *)0x0) break;
      if (0 < pVVar9[lVar17].nSize) {
        piVar10 = pGVar4->pLutRefs;
        if (piVar10 == (int *)0x0) {
          __assert_fail("p->pLutRefs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x25c,"int Gia_ObjLutRefDecId(Gia_Man_t *, int)");
        }
        piVar11 = pVVar9[lVar17].pArray;
        lVar18 = 0;
        do {
          piVar2 = piVar10 + piVar11[lVar18];
          *piVar2 = *piVar2 + -1;
          lVar18 = lVar18 + 1;
        } while (lVar18 < pVVar9[lVar17].nSize);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < pVVar13->nSize);
  }
  pVVar13 = p->vAnds;
  if (0 < pVVar13->nSize) {
    lVar20 = 0;
    do {
      piVar5 = p->pGia->pLutRefs;
      if (piVar5 == (int *)0x0) {
        __assert_fail("p->pLutRefs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x25a,"int Gia_ObjLutRefNumId(Gia_Man_t *, int)");
      }
      if (piVar5[pVVar13->pArray[lVar20]] != 0) {
        Vec_IntPush(p->vRoots,pVVar13->pArray[lVar20]);
      }
      lVar20 = lVar20 + 1;
      pVVar13 = p->vAnds;
    } while (lVar20 < pVVar13->nSize);
  }
  pVVar13 = p->vNodes;
  if (0 < pVVar13->nSize) {
    pGVar4 = p->pGia;
    pVVar7 = pGVar4->vMapping2;
    piVar5 = pVVar13->pArray;
    lVar20 = 0;
    do {
      lVar17 = (long)piVar5[lVar20];
      if ((lVar17 < 0) || (pVVar7->nSize <= piVar5[lVar20])) {
LAB_007c16c2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar9 = pVVar7->pArray;
      if (pVVar9 == (Vec_Int_t *)0x0) {
        return;
      }
      if (0 < pVVar9[lVar17].nSize) {
        piVar10 = pGVar4->pLutRefs;
        if (piVar10 == (int *)0x0) {
          __assert_fail("p->pLutRefs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x25b,"int Gia_ObjLutRefIncId(Gia_Man_t *, int)");
        }
        piVar11 = pVVar9[lVar17].pArray;
        lVar18 = 0;
        do {
          piVar2 = piVar10 + piVar11[lVar18];
          *piVar2 = *piVar2 + 1;
          lVar18 = lVar18 + 1;
        } while (lVar18 < pVVar9[lVar17].nSize);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < pVVar13->nSize);
  }
  return;
}

Assistant:

void Spl_ManWinFindLeavesRoots( Spl_Man_t * p )
{
    Vec_Int_t * vVec;
    int iObj, iFan, i, k;
    // collect leaves
/*
    Vec_IntClear( p->vLeaves );
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
    {
        assert( Vec_BitEntry(p->vMarksNo, iObj) );
        Vec_IntForEachEntry( vVec, iFan, k )
            if ( !Vec_BitEntry(p->vMarksNo, iFan) )
            {
                Vec_BitWriteEntry(p->vMarksNo, iFan, 1);
                Vec_IntPush( p->vLeaves, iFan );
            }
    }
    Vec_IntForEachEntry( p->vLeaves, iFan, i )
        Vec_BitWriteEntry(p->vMarksNo, iFan, 0);
*/
    Vec_IntClear( p->vLeaves );
    Vec_IntForEachEntry( p->vAnds, iObj, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p->pGia, iObj );
        assert( Vec_BitEntry(p->vMarksAnd, iObj) );
        iFan = Gia_ObjFaninId0( pObj, iObj );
        if ( !Vec_BitEntry(p->vMarksAnd, iFan) )
        {
            assert( Gia_ObjIsLut2(p->pGia, iFan) || Vec_BitEntry(p->vMarksCIO, iFan) );
            Vec_BitWriteEntry(p->vMarksAnd, iFan, 1);
            Vec_IntPush( p->vLeaves, iFan );
        }
        iFan = Gia_ObjFaninId1( pObj, iObj );
        if ( !Vec_BitEntry(p->vMarksAnd, iFan) )
        {
            assert( Gia_ObjIsLut2(p->pGia, iFan) || Vec_BitEntry(p->vMarksCIO, iFan) );
            Vec_BitWriteEntry(p->vMarksAnd, iFan, 1);
            Vec_IntPush( p->vLeaves, iFan );
        }
    }
    Vec_IntForEachEntry( p->vLeaves, iFan, i )
        Vec_BitWriteEntry(p->vMarksAnd, iFan, 0);

    // collect roots
    Vec_IntClear( p->vRoots );
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
        Vec_IntForEachEntry( vVec, iFan, k )
            Gia_ObjLutRefDecId( p->pGia, iFan );
    Vec_IntForEachEntry( p->vAnds, iObj, i )
        if ( Gia_ObjLutRefNumId(p->pGia, iObj) )
            Vec_IntPush( p->vRoots, iObj );
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
        Vec_IntForEachEntry( vVec, iFan, k )
            Gia_ObjLutRefIncId( p->pGia, iFan );
}